

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter-mip-test.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1130ba::RedefsMIPTest_PureMILP__01__seemsPassedToBackendCorrectly_Test::
~RedefsMIPTest_PureMILP__01__seemsPassedToBackendCorrectly_Test
          (RedefsMIPTest_PureMILP__01__seemsPassedToBackendCorrectly_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(RedefsMIPTest, PureMILP__01__seemsPassedToBackendCorrectly) {
  MIPInstance milp {
    { { minimize_,
        { { 1, 1, 2.5 },
          { 0, 1, 2 } } } },
    { {  0.0,  0.0, -1.2 },
      {  1.0,  3.0,  5.2 },
      {  I_,   F_,   F_ } },
    {
      { { { 2, 0.0, 4 },
          { 0, 1,   2 } }, -infty_, 56.4 }
    }
  };
  mp::Env e;
  MIPConverterTester tester(e);
  feedInstance(tester, milp);
  tester.ConvertModel();
  ASSERT_TRUE(tester.ObjsEqual(milp));
  ASSERT_TRUE(tester.VarBoundsEqual(milp));
  ASSERT_TRUE(tester.NConstrEqual(milp));
}